

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

mcu8str * mctools_get_current_working_dir(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  ssize_t sVar6;
  undefined8 *extraout_RDX;
  ulong uVar7;
  mcu8str *in_RDI;
  ulong __size;
  char *__buf;
  char buf [4096];
  char acStack_11060 [65560];
  char local_1028 [4104];
  
  __buf = local_1028;
  in_RDI->owns_memory = 0;
  in_RDI->c_str = local_1028;
  local_1028[0] = '\0';
  in_RDI->size = 0;
  in_RDI->buflen = 0x1000;
  uVar7 = 0x1000;
  pcVar4 = getcwd(local_1028,0x1000);
  if (pcVar4 == (char *)0x0) {
    __size = 0x1000;
    piVar5 = __errno_location();
    do {
      iVar3 = (int)uVar7;
      if ((1999999 < (uint)__size) || (*piVar5 != 0x22)) {
        mctools_get_current_working_dir_cold_1();
        in_RDI->owns_memory = 0;
        in_RDI->c_str = acStack_11060;
        in_RDI->size = 0;
        in_RDI->buflen = 0x10001;
        sVar6 = readlink("/proc/self/exe",acStack_11060,0x10000);
        if (0xfffe < sVar6 - 1U) {
          bVar2 = false;
          goto LAB_00102b79;
        }
        acStack_11060[sVar6] = '\0';
        in_RDI->size = (uint)sVar6;
        mcu8str_ensure_dynamic_buffer(in_RDI);
        goto LAB_00102b5e;
      }
      if (in_RDI->size != 0) {
        *__buf = '\0';
        in_RDI->size = 0;
      }
      mcu8str_reserve(in_RDI,(ulong)((uint)__size * 2 - 2));
      __buf = in_RDI->c_str;
      __size = (ulong)in_RDI->buflen;
      uVar7 = __size;
      pcVar4 = getcwd(__buf,__size);
    } while (pcVar4 == (char *)0x0);
  }
  mcu8str_update_size(in_RDI);
  mcu8str_ensure_dynamic_buffer(in_RDI);
  mctools_pathseps_platform(in_RDI);
  return in_RDI;
  while( true ) {
    in_RDI->owns_memory = 0;
    in_RDI->c_str = acStack_11060;
    in_RDI->size = 0;
    in_RDI->buflen = 0x10001;
    sVar6 = readlink("/proc/curproc/file",acStack_11060,0x10000);
    bVar2 = true;
    if (sVar6 - 1U < 0xffff) break;
LAB_00102b79:
    bVar1 = bVar2;
    mcu8str_dealloc(in_RDI);
    if (bVar1) goto LAB_00102bda;
  }
  acStack_11060[sVar6] = '\0';
  in_RDI->size = (uint)sVar6;
  mcu8str_ensure_dynamic_buffer(in_RDI);
  mctools_pathseps_platform(in_RDI);
  if (bVar1) {
LAB_00102bda:
    if ((0 < iVar3) && (*(char *)*extraout_RDX == '/')) {
      mcu8str_create_from_cstr(in_RDI,(char *)*extraout_RDX);
      mctools_pathseps_platform(in_RDI);
      iVar3 = mctools_is_file(in_RDI);
      if (iVar3 != 0) {
LAB_00102b5e:
        mctools_pathseps_platform(in_RDI);
        return in_RDI;
      }
      mcu8str_dealloc(in_RDI);
    }
    in_RDI->c_str = mcu8str_create_empty::dummy;
    in_RDI->size = 0;
    in_RDI->buflen = 0;
    in_RDI->owns_memory = 0;
  }
  return in_RDI;
}

Assistant:

mcu8str mctools_get_current_working_dir(void)
  {
#ifdef MC_IS_WINDOWS
    mcwinstr wpath = mc_winstr_create( 4096 );
    DWORD nsize = GetCurrentDirectoryW((DWORD)wpath.buflen, wpath.c_str);
    if ( (mcu8str_size_t)(nsize + 1) > wpath.buflen ) {
      //Use larger buffer and try again:
      mc_winstr_dealloc( &wpath );
      wpath = mc_winstr_create( nsize );
      nsize = GetCurrentDirectoryW((DWORD)wpath.buflen,wpath.c_str);
    }
    if ( nsize == 0 || (mcu8str_size_t )( nsize + 1 ) > wpath.buflen ) {
      mc_winstr_dealloc( &wpath );
      mctools_impl_error("Failed to get current working directory");
      //return mcu8str_create_empty();
    }
    wpath.c_str[nsize] = 0;
    wpath.size = nsize;
    mcwinstr woutput = mc_impl_expand_wpath_to_longpathname( &wpath );
    mc_winstr_dealloc( &wpath );
    mcu8str res = mc_winstr_to_u8str( &woutput );
    mc_winstr_dealloc( &woutput );
    mctools_pathseps_platform( &res );
    return res;
#else
    char buf[4096];//almost always enough in first go
    mcu8str res = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
    while ( 1 ) {
      if ( getcwd( res.c_str, res.buflen ) ) {
        mcu8str_update_size( &res );
        mcu8str_ensure_dynamic_buffer(&res);//don't return local static buffer
        mctools_pathseps_platform( &res );
        return res;
      }
      if ( errno == ERANGE && res.buflen < 2000000 ) {
        //Try again with larger buffer:
        mcu8str_clear( &res );
        mcu8str_reserve( &res, (res.buflen-1) * 2 );
      } else {
        mcu8str_dealloc( &res );
        mctools_impl_error("Failed to get current working directory");
        //return mcu8str_create_empty();
      }
    }
#endif
  }